

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int archive_read_format_iso9660_read_header(archive_read *a,archive_entry *entry)

{
  long lVar1;
  file_info *_p;
  undefined3 uVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  archive_entry *paVar7;
  int iVar8;
  wchar_t wVar9;
  mode_t mVar10;
  archive_string_conv *paVar11;
  uchar *puVar12;
  void *pvVar13;
  int *piVar14;
  char *pcVar15;
  uint64_t uVar16;
  uint64_t *as;
  size_t local_80;
  zisofs *zisofs;
  int64_t r64;
  char *path;
  int rd_r;
  int r;
  file_info *file;
  iso9660 *iso9660;
  archive_entry *entry_local;
  archive_read *a_local;
  
  path._0_4_ = 0;
  file = (file_info *)a->format->data;
  if ((a->archive).archive_format == 0) {
    (a->archive).archive_format = 0x40000;
    (a->archive).archive_format_name = "ISO9660";
  }
  iso9660 = (iso9660 *)entry;
  entry_local = (archive_entry *)a;
  if ((((iso9660 *)file)->current_position != 0) ||
     (a_local._4_4_ = choose_volume(a,(iso9660 *)file), a_local._4_4_ == 0)) {
    _rd_r = (file_info *)0x0;
    a_local._4_4_ = next_entry_seek((archive_read *)entry_local,(iso9660 *)file,(file_info **)&rd_r)
    ;
    if (a_local._4_4_ == 0) {
      if (*(char *)((long)&file->key + 2) == '\0') {
        pcVar15 = build_pathname((archive_string *)&file->next,_rd_r,0);
        if (pcVar15 == (char *)0x0) {
          archive_set_error((archive *)entry_local,0x54,"Pathname is too long");
          return -0x1e;
        }
        file->re_next = (file_info *)0x0;
        archive_entry_set_pathname((archive_entry *)iso9660,pcVar15);
      }
      else {
        if (file[1].name.buffer_length == 0) {
          paVar11 = archive_string_conversion_from_charset
                              ((archive *)entry_local,"UTF-16BE",L'\x01');
          file[1].name.buffer_length = (size_t)paVar11;
          if (file[1].name.buffer_length == 0) {
            return -0x1e;
          }
        }
        if (file[1].utf16be_name == (uchar *)0x0) {
          puVar12 = (uchar *)malloc(0x400);
          file[1].utf16be_name = puVar12;
          if (file[1].utf16be_name == (uchar *)0x0) {
            archive_set_error((archive *)entry_local,0xc,"No memory");
            return -0x1e;
          }
        }
        if (*(long *)&file[1].name_continues == 0) {
          pvVar13 = malloc(0x400);
          *(void **)&file[1].name_continues = pvVar13;
          if (*(long *)&file[1].name_continues == 0) {
            archive_set_error((archive *)entry_local,0xc,"No memory");
            return -0x1e;
          }
        }
        file[1].utf16be_bytes = 0;
        iVar8 = build_pathname_utf16be(file[1].utf16be_name,0x400,&file[1].utf16be_bytes,_rd_r);
        if (iVar8 != 0) {
          archive_set_error((archive *)entry_local,0x54,"Pathname is too long");
          return -0x1e;
        }
        wVar9 = _archive_entry_copy_pathname_l
                          ((archive_entry *)iso9660,(char *)file[1].utf16be_name,
                           file[1].utf16be_bytes,(archive_string_conv *)file[1].name.buffer_length);
        if (wVar9 != L'\0') {
          piVar14 = __errno_location();
          paVar7 = entry_local;
          if (*piVar14 == 0xc) {
            archive_set_error((archive *)entry_local,0xc,"No memory for Pathname");
            return -0x1e;
          }
          pcVar15 = archive_string_conversion_charset_name
                              ((archive_string_conv *)file[1].name.buffer_length);
          archive_set_error((archive *)paVar7,0x54,
                            "Pathname cannot be converted from %s to current locale.",pcVar15);
          path._0_4_ = -0x14;
        }
      }
      paVar7 = entry_local;
      (file->symlink).s = (char *)_rd_r->size;
      *(undefined8 *)&file->name_continues = 0;
      if ((file->name).length < _rd_r->offset + _rd_r->size) {
        pcVar15 = archive_entry_pathname((archive_entry *)iso9660);
        archive_set_error((archive *)paVar7,-1,"File is beyond end-of-media: %s",pcVar15);
        (file->symlink).s = (char *)0x0;
        a_local._4_4_ = -0x14;
      }
      else {
        archive_entry_set_mode((archive_entry *)iso9660,_rd_r->mode);
        archive_entry_set_uid((archive_entry *)iso9660,(ulong)_rd_r->uid);
        archive_entry_set_gid((archive_entry *)iso9660,(ulong)_rd_r->gid);
        archive_entry_set_nlink((archive_entry *)iso9660,_rd_r->nlinks);
        if (_rd_r->birthtime_is_set == 0) {
          archive_entry_unset_birthtime((archive_entry *)iso9660);
        }
        else {
          archive_entry_set_birthtime((archive_entry *)iso9660,_rd_r->birthtime,0);
        }
        archive_entry_set_mtime((archive_entry *)iso9660,_rd_r->mtime,0);
        archive_entry_set_ctime((archive_entry *)iso9660,_rd_r->ctime,0);
        archive_entry_set_atime((archive_entry *)iso9660,_rd_r->atime,0);
        archive_entry_set_rdev((archive_entry *)iso9660,_rd_r->rdev);
        archive_entry_set_size((archive_entry *)iso9660,(int64_t)(file->symlink).s);
        if ((_rd_r->symlink).s != (char *)0x0) {
          archive_entry_copy_symlink((archive_entry *)iso9660,(_rd_r->symlink).s);
        }
        if ((_rd_r->number == -1) ||
           (lVar1._0_1_ = file->rr_moved, lVar1._1_1_ = file->rr_moved_has_re_only,
           lVar1._2_1_ = file->re, lVar1._3_1_ = file->re_descendant,
           lVar1._4_4_ = *(undefined4 *)&file->field_0x4c, _rd_r->number != lVar1)) {
          if (((_rd_r->mode & 0xf000) != 0x4000) && (_rd_r->offset < *(ulong *)&file->nlinks)) {
            uVar16 = __archive_read_seek((archive_read *)entry_local,_rd_r->offset,0);
            if (uVar16 != _rd_r->offset) {
              archive_set_error((archive *)entry_local,-1,
                                "Ignoring out-of-order file @%jx (%s) %jd < %jd",_rd_r->number,
                                file->next,_rd_r->offset,*(undefined8 *)&file->nlinks);
              (file->symlink).s = (char *)0x0;
              return -0x14;
            }
            *(uint64_t *)&file->nlinks = uVar16;
          }
          *(int *)&(file->symlink).buffer_length = _rd_r->pz;
          if (_rd_r->pz != 0) {
            file->pz_log2_bs = 0;
            *(int *)((long)&(file->symlink).buffer_length + 4) = _rd_r->pz_log2_bs;
            uVar2 = *(undefined3 *)((long)&_rd_r->pz_uncompressed_size + 1);
            uVar3 = *(undefined4 *)((long)&_rd_r->pz_uncompressed_size + 4);
            file->symlink_continues = *(undefined1 *)&_rd_r->pz_uncompressed_size;
            *(undefined3 *)&file->field_0xf1 = uVar2;
            file->pz = uVar3;
            *(undefined4 *)&(file->contents).first = 0;
            (file->rede_files).last = (file_info **)0x0;
            *(undefined4 *)&file[1].use_next = 0;
            *(undefined8 *)&file[1].subdirs = 0;
            archive_entry_set_size((archive_entry *)iso9660,_rd_r->pz_uncompressed_size);
          }
          uVar4 = *(undefined1 *)((long)&_rd_r->number + 1);
          uVar5 = *(undefined1 *)((long)&_rd_r->number + 2);
          uVar6 = *(undefined1 *)((long)&_rd_r->number + 3);
          uVar3 = *(undefined4 *)((long)&_rd_r->number + 4);
          file->rr_moved = *(undefined1 *)&_rd_r->number;
          file->rr_moved_has_re_only = uVar4;
          file->re = uVar5;
          file->re_descendant = uVar6;
          *(undefined4 *)&file->field_0x4c = uVar3;
          if (*(char *)((long)&file->key + 2) == '\0') {
            *(undefined8 *)&file->birthtime_is_set = 0;
            as = &file->cl_offset;
            _p = file->next;
            if (file->next == (file_info *)0x0) {
              local_80 = 0;
            }
            else {
              local_80 = strlen((char *)file->next);
            }
            archive_strncat((archive_string *)as,_p,local_80);
          }
          else {
            memcpy(*(void **)&file[1].name_continues,file[1].utf16be_name,file[1].utf16be_bytes);
            file[1].symlink.s = (char *)file[1].utf16be_bytes;
          }
          file[1].name.length = (size_t)(_rd_r->contents).first;
          if (file[1].name.length != 0) {
            (file->symlink).s = *(char **)(file[1].name.length + 8);
          }
          mVar10 = archive_entry_filetype((archive_entry *)iso9660);
          if (mVar10 == 0x4000) {
            archive_entry_set_nlink((archive_entry *)iso9660,_rd_r->subdirs + 2);
            (file->symlink).s = (char *)0x0;
          }
          if ((int)path == 0) {
            a_local._4_4_ = 0;
          }
          else {
            a_local._4_4_ = (int)path;
          }
        }
        else {
          if (*(char *)((long)&file->key + 2) == '\0') {
            archive_entry_set_hardlink((archive_entry *)iso9660,(char *)file->cl_offset);
          }
          else {
            wVar9 = _archive_entry_copy_hardlink_l
                              ((archive_entry *)iso9660,*(char **)&file[1].name_continues,
                               (size_t)file[1].symlink.s,
                               (archive_string_conv *)file[1].name.buffer_length);
            if (wVar9 != L'\0') {
              piVar14 = __errno_location();
              paVar7 = entry_local;
              if (*piVar14 == 0xc) {
                archive_set_error((archive *)entry_local,0xc,"No memory for Linkname");
                return -0x1e;
              }
              pcVar15 = archive_string_conversion_charset_name
                                  ((archive_string_conv *)file[1].name.buffer_length);
              archive_set_error((archive *)paVar7,0x54,
                                "Linkname cannot be converted from %s to current locale.",pcVar15);
              path._0_4_ = -0x14;
            }
          }
          archive_entry_unset_size((archive_entry *)iso9660);
          (file->symlink).s = (char *)0x0;
          a_local._4_4_ = (int)path;
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_iso9660_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct iso9660 *iso9660;
	struct file_info *file;
	int r, rd_r = ARCHIVE_OK;

	iso9660 = (struct iso9660 *)(a->format->data);

	if (!a->archive.archive_format) {
		a->archive.archive_format = ARCHIVE_FORMAT_ISO9660;
		a->archive.archive_format_name = "ISO9660";
	}

	if (iso9660->current_position == 0) {
		r = choose_volume(a, iso9660);
		if (r != ARCHIVE_OK)
			return (r);
	}

	file = NULL;/* Eliminate a warning. */
	/* Get the next entry that appears after the current offset. */
	r = next_entry_seek(a, iso9660, &file);
	if (r != ARCHIVE_OK)
		return (r);

	if (iso9660->seenJoliet) {
		/*
		 * Convert UTF-16BE of a filename to local locale MBS
		 * and store the result into a filename field.
		 */
		if (iso9660->sconv_utf16be == NULL) {
			iso9660->sconv_utf16be =
			    archive_string_conversion_from_charset(
				&(a->archive), "UTF-16BE", 1);
			if (iso9660->sconv_utf16be == NULL)
				/* Coundn't allocate memory */
				return (ARCHIVE_FATAL);
		}
		if (iso9660->utf16be_path == NULL) {
			iso9660->utf16be_path = malloc(UTF16_NAME_MAX);
			if (iso9660->utf16be_path == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory");
				return (ARCHIVE_FATAL);
			}
		}
		if (iso9660->utf16be_previous_path == NULL) {
			iso9660->utf16be_previous_path = malloc(UTF16_NAME_MAX);
			if (iso9660->utf16be_previous_path == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory");
				return (ARCHIVE_FATAL);
			}
		}

		iso9660->utf16be_path_len = 0;
		if (build_pathname_utf16be(iso9660->utf16be_path,
		    UTF16_NAME_MAX, &(iso9660->utf16be_path_len), file) != 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Pathname is too long");
			return (ARCHIVE_FATAL);
		}

		r = archive_entry_copy_pathname_l(entry,
		    (const char *)iso9660->utf16be_path,
		    iso9660->utf16be_path_len,
		    iso9660->sconv_utf16be);
		if (r != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for Pathname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Pathname cannot be converted "
			    "from %s to current locale.",
			    archive_string_conversion_charset_name(
			      iso9660->sconv_utf16be));

			rd_r = ARCHIVE_WARN;
		}
	} else {
		const char *path = build_pathname(&iso9660->pathname, file, 0);
		if (path == NULL) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Pathname is too long");
			return (ARCHIVE_FATAL);
		} else {
			archive_string_empty(&iso9660->pathname);
			archive_entry_set_pathname(entry, path);
		}
	}

	iso9660->entry_bytes_remaining = file->size;
	/* Offset for sparse-file-aware clients. */
	iso9660->entry_sparse_offset = 0;

	if (file->offset + file->size > iso9660->volume_size) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "File is beyond end-of-media: %s",
		    archive_entry_pathname(entry));
		iso9660->entry_bytes_remaining = 0;
		return (ARCHIVE_WARN);
	}

	/* Set up the entry structure with information about this entry. */
	archive_entry_set_mode(entry, file->mode);
	archive_entry_set_uid(entry, file->uid);
	archive_entry_set_gid(entry, file->gid);
	archive_entry_set_nlink(entry, file->nlinks);
	if (file->birthtime_is_set)
		archive_entry_set_birthtime(entry, file->birthtime, 0);
	else
		archive_entry_unset_birthtime(entry);
	archive_entry_set_mtime(entry, file->mtime, 0);
	archive_entry_set_ctime(entry, file->ctime, 0);
	archive_entry_set_atime(entry, file->atime, 0);
	/* N.B.: Rock Ridge supports 64-bit device numbers. */
	archive_entry_set_rdev(entry, (dev_t)file->rdev);
	archive_entry_set_size(entry, iso9660->entry_bytes_remaining);
	if (file->symlink.s != NULL)
		archive_entry_copy_symlink(entry, file->symlink.s);

	/* Note: If the input isn't seekable, we can't rewind to
	 * return the same body again, so if the next entry refers to
	 * the same data, we have to return it as a hardlink to the
	 * original entry. */
	if (file->number != -1 &&
	    file->number == iso9660->previous_number) {
		if (iso9660->seenJoliet) {
			r = archive_entry_copy_hardlink_l(entry,
			    (const char *)iso9660->utf16be_previous_path,
			    iso9660->utf16be_previous_path_len,
			    iso9660->sconv_utf16be);
			if (r != 0) {
				if (errno == ENOMEM) {
					archive_set_error(&a->archive, ENOMEM,
					    "No memory for Linkname");
					return (ARCHIVE_FATAL);
				}
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Linkname cannot be converted "
				    "from %s to current locale.",
				    archive_string_conversion_charset_name(
				      iso9660->sconv_utf16be));
				rd_r = ARCHIVE_WARN;
			}
		} else
			archive_entry_set_hardlink(entry,
			    iso9660->previous_pathname.s);
		archive_entry_unset_size(entry);
		iso9660->entry_bytes_remaining = 0;
		return (rd_r);
	}

	if ((file->mode & AE_IFMT) != AE_IFDIR &&
	    file->offset < iso9660->current_position) {
		int64_t r64;

		r64 = __archive_read_seek(a, file->offset, SEEK_SET);
		if (r64 != (int64_t)file->offset) {
			/* We can't seek backwards to extract it, so issue
			 * a warning.  Note that this can only happen if
			 * this entry was added to the heap after we passed
			 * this offset, that is, only if the directory
			 * mentioning this entry is later than the body of
			 * the entry. Such layouts are very unusual; most
			 * ISO9660 writers lay out and record all directory
			 * information first, then store all file bodies. */
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Ignoring out-of-order file @%jx (%s) %jd < %jd",
			    (intmax_t)file->number,
			    iso9660->pathname.s,
			    (intmax_t)file->offset,
			    (intmax_t)iso9660->current_position);
			iso9660->entry_bytes_remaining = 0;
			return (ARCHIVE_WARN);
		}
		iso9660->current_position = (uint64_t)r64;
	}

	/* Initialize zisofs variables. */
	iso9660->entry_zisofs.pz = file->pz;
	if (file->pz) {
#ifdef HAVE_ZLIB_H
		struct zisofs  *zisofs;

		zisofs = &iso9660->entry_zisofs;
		zisofs->initialized = 0;
		zisofs->pz_log2_bs = file->pz_log2_bs;
		zisofs->pz_uncompressed_size = file->pz_uncompressed_size;
		zisofs->pz_offset = 0;
		zisofs->header_avail = 0;
		zisofs->header_passed = 0;
		zisofs->block_pointers_avail = 0;
#endif
		archive_entry_set_size(entry, file->pz_uncompressed_size);
	}

	iso9660->previous_number = file->number;
	if (iso9660->seenJoliet) {
		memcpy(iso9660->utf16be_previous_path, iso9660->utf16be_path,
		    iso9660->utf16be_path_len);
		iso9660->utf16be_previous_path_len = iso9660->utf16be_path_len;
	} else
		archive_strcpy(
		    &iso9660->previous_pathname, iso9660->pathname.s);

	/* Reset entry_bytes_remaining if the file is multi extent. */
	iso9660->entry_content = file->contents.first;
	if (iso9660->entry_content != NULL)
		iso9660->entry_bytes_remaining = iso9660->entry_content->size;

	if (archive_entry_filetype(entry) == AE_IFDIR) {
		/* Overwrite nlinks by proper link number which is
		 * calculated from number of sub directories. */
		archive_entry_set_nlink(entry, 2 + file->subdirs);
		/* Directory data has been read completely. */
		iso9660->entry_bytes_remaining = 0;
	}

	if (rd_r != ARCHIVE_OK)
		return (rd_r);
	return (ARCHIVE_OK);
}